

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

Status google::protobuf::json_internal::anon_unknown_5::
       ParseTimestamp<google::protobuf::json_internal::ParseProto3Type>
                 (JsonLexer *lex,Desc<google::protobuf::json_internal::ParseProto3Type> *desc,
                 Msg<google::protobuf::json_internal::ParseProto3Type> *msg)

{
  char cVar1;
  bool bVar2;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar3;
  optional<unsigned_int> oVar4;
  _Optional_payload_base<unsigned_int> _Var5;
  optional<int> oVar6;
  optional<unsigned_int> oVar7;
  Field pFVar8;
  ulong uVar9;
  undefined8 uVar10;
  int iVar11;
  Msg *in_RCX;
  char *pcVar12;
  ulong uVar13;
  _Storage<unsigned_int,_true> _Var14;
  char *in_R8;
  uint uVar15;
  bool bVar16;
  string_view end;
  string_view end_00;
  string_view end_01;
  string_view end_02;
  string_view end_03;
  string_view end_04;
  string_view end_05;
  string_view end_06;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  string_view local_b8;
  _Storage<unsigned_int,_true> local_a8;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_a0;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_98;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_68;
  Msg *local_48;
  _Optional_payload_base<unsigned_int> local_40;
  _Storage<unsigned_int,_true> local_38;
  
  local_48 = in_RCX;
  JsonLexer::PeekKind((JsonLexer *)&local_a0.status_);
  aVar3 = local_a0;
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_a0.status_);
  if ((aVar3 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                 )0x1) && (local_98._0_4_ == 6)) {
    JsonLexer::Expect(lex,desc,4,"null");
    return (Status)(uintptr_t)lex;
  }
  JsonLexer::ParseUtf8
            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              *)&local_a0.status_,(JsonLexer *)desc);
  (lex->stream_).stream_ = (ZeroCopyInputStream *)local_a0;
  if (((ulong)local_a0 & 1) == 0) {
    LOCK();
    *(int *)local_a0 = *(int *)local_a0 + 1;
    UNLOCK();
  }
  if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002cc114;
  if (local_a0 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
       )0x1) {
    local_b8 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_98._M_first);
    if (local_b8._M_len < 0x14) {
      if (local_a0 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid((JsonLocation *)lex,&local_68,0x1a,"timestamp string too short");
        goto LAB_002cc114;
      }
      goto LAB_002cc355;
    }
    end._M_str = in_R8;
    end._M_len = (size_t)"-";
    oVar4 = TakeTimeDigitsWithSuffixAndAdvance((anon_unknown_5 *)&local_b8,(string_view *)0x4,1,end)
    ;
    if ((oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_engaged &
        oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload != 0) != 0) {
      end_00._M_str = in_R8;
      end_00._M_len = (size_t)"-";
      oVar7 = TakeTimeDigitsWithSuffixAndAdvance
                        ((anon_unknown_5 *)&local_b8,(string_view *)0x2,1,end_00);
      _Var14._M_value =
           oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
      if (((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0x100000000) == 0 ||
          _Var14._M_value == 0) {
        if (local_a0 ==
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )0x1) {
          JsonLocation::Invalid((JsonLocation *)lex,&local_68,0x16,"bad month in timestamp");
          goto LAB_002cc098;
        }
        goto LAB_002cc373;
      }
      end_01._M_str = in_R8;
      end_01._M_len = (size_t)"T";
      _Var5 = (_Optional_payload_base<unsigned_int>)
              TakeTimeDigitsWithSuffixAndAdvance
                        ((anon_unknown_5 *)&local_b8,(string_view *)0x2,1,end_01);
      if (((ulong)_Var5 & 0x100000000) == 0 || _Var5._M_payload._M_value == 0) {
        if (local_a0 ==
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )0x1) {
          JsonLocation::Invalid((JsonLocation *)lex,&local_68,0x14,"bad day in timestamp");
          goto LAB_002cc098;
        }
        goto LAB_002cc37d;
      }
      end_02._M_str = in_R8;
      end_02._M_len = (size_t)":";
      _local_a8 = (_Optional_payload_base<unsigned_int>)
                  TakeTimeDigitsWithSuffixAndAdvance
                            ((anon_unknown_5 *)&local_b8,(string_view *)0x2,1,end_02);
      if (((ulong)_local_a8 & 0x100000000) == 0) {
        if (local_a0 ==
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )0x1) {
          JsonLocation::Invalid((JsonLocation *)lex,&local_68,0x16,"bad hours in timestamp");
          goto LAB_002cc098;
        }
        goto LAB_002cc391;
      }
      end_03._M_str = in_R8;
      end_03._M_len = (size_t)":";
      _local_38 = (_Optional_payload_base<unsigned_int>)
                  TakeTimeDigitsWithSuffixAndAdvance
                            ((anon_unknown_5 *)&local_b8,(string_view *)0x2,1,end_03);
      if (((ulong)_local_38 & 0x100000000) != 0) {
        end_06._M_str = in_R8;
        end_06._M_len = (size_t)"";
        local_40 = _Var5;
        oVar7 = TakeTimeDigitsWithSuffixAndAdvance
                          ((anon_unknown_5 *)&local_b8,(string_view *)0x2,0,end_06);
        bVar16 = ((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int> & 0x100000000) == 0;
        bVar2 = !bVar16;
        if (bVar16) {
          if (local_a0 !=
              (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
               )0x1) goto LAB_002cc3af;
          JsonLocation::Invalid((JsonLocation *)lex,&local_68,0x18,"bad seconds in timestamp");
        }
        else {
          iVar11 = _Var14._M_value + 9;
          if (2 < _Var14._M_value) {
            iVar11 = _Var14._M_value - 3;
          }
          uVar15 = (oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_payload -
                   (uint)(_Var14._M_value < 3)) + 0x12c0;
          uVar15 = uVar15 * 0x16d + uVar15 / 400 + ((uVar15 >> 2) - uVar15 / 100) +
                   (iVar11 * 0xf4ff + 0x301U >> 0xb);
          in_R8 = (char *)(ulong)uVar15;
          _local_a8 = (_Optional_payload_base<unsigned_int>)
                      (((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                               super__Optional_payload_base<unsigned_int> & 0xffffffff) +
                       (ulong)(local_38._M_value * 0x3c) + (ulong)(local_a8._M_value * 0xe10) +
                      (long)(int)(local_40._M_payload._M_value + uVar15 + -0x25bab9) * 0x15180);
        }
        goto LAB_002cc09b;
      }
      if (local_a0 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid((JsonLocation *)lex,&local_68,0x18,"bad minutes in timestamp");
        goto LAB_002cc098;
      }
      goto LAB_002cc39b;
    }
    if (local_a0 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) goto LAB_002cc35f;
    JsonLocation::Invalid((JsonLocation *)lex,&local_68,0x15,"bad year in timestamp");
LAB_002cc098:
    bVar2 = false;
LAB_002cc09b:
    if (!bVar2) goto LAB_002cc114;
    oVar6 = TakeNanosAndAdvance(&local_b8);
    if (((ulong)oVar6.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> & 0x100000000) == 0) {
      if (local_a0 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        pcVar12 = "timestamp had bad nanoseconds";
        uVar10 = 0x1d;
LAB_002cc107:
        JsonLocation::Invalid((JsonLocation *)lex,&local_68,uVar10,pcVar12);
        goto LAB_002cc114;
      }
      goto LAB_002cc369;
    }
    if (local_b8._M_len == 0) {
      if (local_a0 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        pcVar12 = "timestamp missing timezone offset";
        uVar10 = 0x21;
        goto LAB_002cc107;
      }
      goto LAB_002cc369;
    }
    cVar1 = *local_b8._M_str;
    if (cVar1 != '+') {
      if (cVar1 == 'Z') {
        bVar2 = true;
        if (local_b8._M_len != 1) goto LAB_002cc13f;
      }
      else {
        if (cVar1 == '-') {
          bVar2 = true;
          goto LAB_002cc15f;
        }
LAB_002cc13f:
        if (local_a0 !=
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )0x1) goto LAB_002cc387;
        uVar10 = 0x13;
LAB_002cc1fa:
        JsonLocation::Invalid((JsonLocation *)lex,&local_68,uVar10);
LAB_002cc207:
        bVar2 = false;
      }
LAB_002cc209:
      if (bVar2) {
        pFVar8 = Proto3Type::MustHaveField(msg,1);
        ParseProto3Type::
        SetInt<long,(google::protobuf::Field_Kind)3,(google::protobuf::Field_Kind)16,(google::protobuf::Field_Kind)18>
                  (pFVar8,local_48,(long)_local_a8);
        pFVar8 = Proto3Type::MustHaveField(msg,2);
        ParseProto3Type::
        SetInt<int,(google::protobuf::Field_Kind)5,(google::protobuf::Field_Kind)15,(google::protobuf::Field_Kind)17>
                  (pFVar8,local_48,
                   oVar6.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_payload);
        (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
      }
LAB_002cc114:
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_a0.status_);
      return (Status)(uintptr_t)lex;
    }
    bVar2 = false;
LAB_002cc15f:
    if (local_b8._M_len != 6) {
      if (local_a0 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        uVar10 = 0x1f;
        goto LAB_002cc1fa;
      }
      goto LAB_002cc387;
    }
    local_b8._M_str = local_b8._M_str + 1;
    local_b8._M_len = 5;
    end_04._M_str = in_R8;
    end_04._M_len = (size_t)":";
    oVar4 = TakeTimeDigitsWithSuffixAndAdvance
                      ((anon_unknown_5 *)&local_b8,(string_view *)0x2,1,end_04);
    end_05._M_str = in_R8;
    end_05._M_len = (size_t)"";
    oVar7 = TakeTimeDigitsWithSuffixAndAdvance
                      ((anon_unknown_5 *)&local_b8,(string_view *)0x2,0,end_05);
    if (((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0x100000000) != 0 &&
        ((ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
      uVar9 = (ulong)((oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload +
                      oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>._M_payload * 0x3c) * 0x3c);
      uVar13 = -uVar9;
      if (bVar2) {
        uVar13 = uVar9;
      }
      _local_a8 = (_Optional_payload_base<unsigned_int>)((long)_local_a8 + uVar13);
      bVar2 = true;
      goto LAB_002cc209;
    }
    if (local_a0 ==
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      JsonLocation::Invalid((JsonLocation *)lex,&local_68,0x2a);
      goto LAB_002cc207;
    }
  }
  else {
LAB_002cc355:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
LAB_002cc35f:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
LAB_002cc369:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
LAB_002cc373:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
LAB_002cc37d:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
LAB_002cc387:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
LAB_002cc391:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
LAB_002cc39b:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
  }
  absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
LAB_002cc3af:
  uVar10 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_a0.status_);
  _Unwind_Resume(uVar10);
}

Assistant:

absl::Status ParseTimestamp(JsonLexer& lex, const Desc<Traits>& desc,
                            Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
  RETURN_IF_ERROR(str.status());

  absl::string_view data = str->value.AsView();
  if (data.size() < 20) {
    return str->loc.Invalid("timestamp string too short");
  }

  int64_t secs;
  {
    /* 1972-01-01T01:00:00 */
    auto year = TakeTimeDigitsWithSuffixAndAdvance(data, 4, "-");
    if (!year.has_value() || *year == 0) {
      return str->loc.Invalid("bad year in timestamp");
    }
    auto mon = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "-");
    if (!mon.has_value() || *mon == 0) {
      return str->loc.Invalid("bad month in timestamp");
    }
    auto day = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "T");
    if (!day.has_value() || *day == 0) {
      return str->loc.Invalid("bad day in timestamp");
    }
    auto hour = TakeTimeDigitsWithSuffixAndAdvance(data, 2, ":");
    if (!hour.has_value()) {
      return str->loc.Invalid("bad hours in timestamp");
    }
    auto min = TakeTimeDigitsWithSuffixAndAdvance(data, 2, ":");
    if (!min.has_value()) {
      return str->loc.Invalid("bad minutes in timestamp");
    }
    auto sec = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "");
    if (!sec.has_value()) {
      return str->loc.Invalid("bad seconds in timestamp");
    }

    uint32_t m_adj = *mon - 3;  // March-based month.
    uint32_t carry = m_adj > *mon ? 1 : 0;

    uint32_t year_base = 4800;  // Before min year, multiple of 400.
    uint32_t y_adj = *year + year_base - carry;

    uint32_t month_days = ((m_adj + carry * 12) * 62719 + 769) / 2048;
    uint32_t leap_days = y_adj / 4 - y_adj / 100 + y_adj / 400;
    int32_t epoch_days =
        y_adj * 365 + leap_days + month_days + (*day - 1) - 2472632;

    secs = int64_t{epoch_days} * 86400 + *hour * 3600 + *min * 60 + *sec;
  }

  auto nanos = TakeNanosAndAdvance(data);
  if (!nanos.has_value()) {
    return str->loc.Invalid("timestamp had bad nanoseconds");
  }

  if (data.empty()) {
    return str->loc.Invalid("timestamp missing timezone offset");
  }

  {
    // [+-]hh:mm or Z
    bool neg = false;
    switch (data[0]) {
      case '-':
        neg = true;
        ABSL_FALLTHROUGH_INTENDED;
      case '+': {
        if (data.size() != 6) {
          return str->loc.Invalid("timestamp offset of wrong size.");
        }

        data = data.substr(1);
        auto hour = TakeTimeDigitsWithSuffixAndAdvance(data, 2, ":");
        auto mins = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "");
        if (!hour.has_value() || !mins.has_value()) {
          return str->loc.Invalid("timestamp offset has bad hours and minutes");
        }

        int64_t offset = (*hour * 60 + *mins) * 60;
        secs += (neg ? offset : -offset);
        break;
      }
      // Lowercase z is not accepted, per the spec.
      case 'Z':
        if (data.size() == 1) {
          break;
        }
        ABSL_FALLTHROUGH_INTENDED;
      default:
        return str->loc.Invalid("bad timezone offset");
    }
  }

  Traits::SetInt64(Traits::MustHaveField(desc, 1), msg, secs);
  Traits::SetInt32(Traits::MustHaveField(desc, 2), msg, *nanos);

  return absl::OkStatus();
}